

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

DebuggerScope * Js::LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame *frame)

{
  DebuggerScope *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FunctionBody *this_00;
  WriteBarrierPtr *this_01;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar3;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar4;
  WriteBarrierPtr *this_02;
  DebuggerScope **ppDVar5;
  DebuggerScope *scope;
  int i;
  ScopeObjectChain *scopeObjectChain;
  DiagStackFrame *frame_local;
  
  iVar2 = (*frame->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar2));
  this_01 = (WriteBarrierPtr *)FunctionBody::GetScopeObjectChain(this_00);
  if ((this_01 != (WriteBarrierPtr *)0x0) &&
     (ppLVar3 = Memory::WriteBarrierPtr::operator_cast_to_List__(this_01),
     *ppLVar3 !=
     (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
     0x0)) {
    scope._4_4_ = 0;
    while( true ) {
      pLVar4 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->((WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                             *)this_01);
      iVar2 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                        (&pLVar4->
                          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                        );
      if (iVar2 <= scope._4_4_) break;
      pLVar4 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->((WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                             *)this_01);
      this_02 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(pLVar4,scope._4_4_);
      ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this_02);
      this = *ppDVar5;
      bVar1 = DebuggerScope::IsParamScope(this);
      if (bVar1) {
        return this;
      }
      scope._4_4_ = scope._4_4_ + 1;
    }
  }
  return (DebuggerScope *)0x0;
}

Assistant:

DebuggerScope * LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame* frame)
    {
        Js::ScopeObjectChain * scopeObjectChain = frame->GetJavascriptFunction()->GetFunctionBody()->GetScopeObjectChain();

        if (scopeObjectChain != nullptr && scopeObjectChain->pScopeChain != nullptr)
        {
            for (int i = 0; i < scopeObjectChain->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope * scope = scopeObjectChain->pScopeChain->Item(i);
                if (scope->IsParamScope())
                {
                    return scope;
                }
            }
        }

        return nullptr;
    }